

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O0

subset_iterator<const_char_*,_std::less<void>,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
* __thiscall
burst::make_subset_iterator<std::initializer_list<char>const&>
          (subset_iterator<const_char_*,_std::less<void>,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
           *__return_storage_ptr__,burst *this,initializer_list<char> *range)

{
  burst *this_00;
  char *first;
  char *last;
  initializer_list<char> *range_local;
  
  this_00 = (burst *)std::begin<char>(*(initializer_list<char> *)this);
  last = *(char **)this;
  first = std::end<char>(*(initializer_list<char> *)this);
  make_subset_iterator<char_const*>(__return_storage_ptr__,this_00,first,last);
  return __return_storage_ptr__;
}

Assistant:

auto make_subset_iterator (ForwardRange && range)
    {
        using std::begin;
        using std::end;
        return
            make_subset_iterator
            (
                begin(std::forward<ForwardRange>(range)),
                end(std::forward<ForwardRange>(range))
            );
    }